

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

bool Remove(Vector *V,int i)

{
  int iVar1;
  ElementType *pEVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  
  iVar1 = V->VectorLength;
  if (iVar1 == 0) {
    pcVar5 = "Vector is empty!";
    lVar4 = 0x10;
  }
  else {
    if (i < iVar1 && -1 < i) {
      if (iVar1 < 3) {
        uVar3 = (ulong)(iVar1 - 1);
      }
      else {
        pEVar2 = V->elements;
        lVar4 = 1;
        do {
          pEVar2[lVar4] = pEVar2[lVar4 + 1];
          lVar4 = lVar4 + 1;
          uVar3 = (long)V->VectorLength - 1;
        } while (lVar4 < (long)uVar3);
      }
      V->VectorLength = (int)uVar3;
      return true;
    }
    pcVar5 = "position error!";
    lVar4 = 0xf;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return false;
}

Assistant:

bool Remove(Vector *V,int i)  //删除向量的第i个表目
{
    if(V->VectorLength == 0)  //空向量
    {
        cout << "Vector is empty!" << endl;
        return false;
    }
    else if(i<0||i>V->VectorLength-1)  //删除位置错误
    {
        cout << "position error!" << endl;
        return false;
    }
    else {
        int j;
        for (j = 1; j < V->VectorLength - 1; j++)  //前移
            V->elements[j] = V->elements[j+1];
        V->VectorLength--;   //向量长度减1
        return true;
    }
}